

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_BinaryEqualTwoBytes_Test::TEST_TestFailure_BinaryEqualTwoBytes_Test
          (TEST_TestFailure_BinaryEqualTwoBytes_Test *this)

{
  TEST_TestFailure_BinaryEqualTwoBytes_Test *this_local;
  
  memset(this,0,0x10);
  TEST_GROUP_CppUTestGroupTestFailure::TEST_GROUP_CppUTestGroupTestFailure
            (&this->super_TEST_GROUP_CppUTestGroupTestFailure);
  (this->super_TEST_GROUP_CppUTestGroupTestFailure).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_TestFailure_BinaryEqualTwoBytes_Test_003dccd8;
  return;
}

Assistant:

TEST(TestFailure, BinaryEqualTwoBytes)
{
    const unsigned char expectedData[] = {0x00, 0x01};
    const unsigned char actualData[] = {0x00, 0x02};
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "");
    FAILURE_EQUAL("expected <00 01>\n"
                "\tbut was  <00 02>\n"
    			"\tdifference starts at position 1 at: <      00 02         >\n"
    			"\t                                               ^", f);
}